

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O3

int acutest_check_(int cond,char *file,int line,char *fmt,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  int color;
  bool bVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [32];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  va_list args;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  if (acutest_test_skip_count_ == 0) {
    bVar5 = cond == 0;
    local_e8 = in_R8;
    local_e0 = in_R9;
    if (bVar5) {
      if ((acutest_test_already_logged_ == 0) && (acutest_current_test_ != (acutest_test_ *)0x0)) {
        acutest_finish_test_line_(ACUTEST_STATE_FAILED);
      }
      acutest_test_failures_ = acutest_test_failures_ + 1;
      acutest_test_already_logged_ = acutest_test_already_logged_ + 1;
      iVar1 = 2;
      color = 1;
      pcVar3 = "failed";
    }
    else {
      iVar1 = 3;
      color = 2;
      pcVar3 = "ok";
    }
    if (iVar1 <= acutest_verbose_level_) {
      if (acutest_case_name_[0] != '\0' && acutest_case_already_logged_ == 0) {
        acutest_line_indent_(1);
        acutest_colored_printf_(10,"Case %s:\n",acutest_case_name_);
        acutest_test_already_logged_ = acutest_test_already_logged_ + 1;
        acutest_case_already_logged_ = acutest_case_already_logged_ + 1;
      }
      acutest_line_indent_(2 - (uint)(acutest_case_name_[0] == '\0'));
      if (file != (char *)0x0) {
        pcVar2 = strrchr(file,0x2f);
        pcVar4 = pcVar2 + 1;
        if (pcVar2 == (char *)0x0) {
          pcVar4 = file;
        }
        printf("%s:%d: ",pcVar4,(ulong)(uint)line);
      }
      args[0].overflow_arg_area = local_108;
      args[0]._0_8_ = &stack0x00000008;
      local_58 = 0x3000000020;
      vprintf(fmt,&local_58);
      printf("... ");
      acutest_colored_printf_(color,"%s",pcVar3);
      putchar(10);
      acutest_test_already_logged_ = acutest_test_already_logged_ + 1;
    }
    acutest_test_check_count_ = acutest_test_check_count_ + 1;
  }
  else {
    bVar5 = false;
  }
  acutest_cond_failed_ = (uint)bVar5;
  return (int)(bVar5 ^ 1);
}

Assistant:

acutest_check_(int cond, const char* file, int line, const char* fmt, ...)
{
    const char *result_str;
    int result_color;
    int verbose_level;

    if(acutest_test_skip_count_) {
        /* We've skipped the test. We shouldn't be here: The test implementation
         * should have already return before. So lets suppress the following
         * output. */
        cond = 1;
        goto skip_check;
    }

    if(cond) {
        result_str = "ok";
        result_color = ACUTEST_COLOR_GREEN_;
        verbose_level = 3;
    } else {
        if(!acutest_test_already_logged_  &&  acutest_current_test_ != NULL)
            acutest_finish_test_line_(ACUTEST_STATE_FAILED);

        acutest_test_failures_++;
        acutest_test_already_logged_++;

        result_str = "failed";
        result_color = ACUTEST_COLOR_RED_;
        verbose_level = 2;
    }

    if(acutest_verbose_level_ >= verbose_level) {
        va_list args;

        if(!acutest_case_already_logged_  &&  acutest_case_name_[0]) {
            acutest_line_indent_(1);
            acutest_colored_printf_(ACUTEST_COLOR_DEFAULT_INTENSIVE_, "Case %s:\n", acutest_case_name_);
            acutest_test_already_logged_++;
            acutest_case_already_logged_++;
        }

        acutest_line_indent_(acutest_case_name_[0] ? 2 : 1);
        if(file != NULL) {
            file = acutest_basename_(file);
            printf("%s:%d: ", file, line);
        }

        va_start(args, fmt);
        vprintf(fmt, args);
        va_end(args);

        printf("... ");
        acutest_colored_printf_(result_color, "%s", result_str);
        printf("\n");
        acutest_test_already_logged_++;
    }

    acutest_test_check_count_++;

skip_check:
    acutest_cond_failed_ = (cond == 0);
    return !acutest_cond_failed_;
}